

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O0

void __thiscall CodeGen::CodeGen(CodeGen *this)

{
  ostringstream local_188 [376];
  CodeGen *local_10;
  CodeGen *this_local;
  
  local_10 = this;
  Listener::Listener(&this->super_Listener);
  (this->super_Listener).super_Visitor._vptr_Visitor = (_func_int **)&PTR_visit_0012ccf0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->builder);
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::ostringstream::operator=((ostringstream *)&this->builder,local_188);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  this->indentLevel = 1;
  std::operator<<((ostream *)&this->builder,
                  "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n"
                 );
  std::operator<<((ostream *)&this->builder,
                  "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n"
                 );
  return;
}

Assistant:

explicit inline CodeGen() {
        builder = {};
        indentLevel = 1;

        builder << "// Generated by bfc\n#include <stdio.h>\n#include <stdlib.h>\n#include <string.h>\n\nint main() {\n";
        builder << "  unsigned char* memory = (unsigned char*) malloc(80000);\n  memset(memory, 0, 80000);\n  long long current = 40000;\n";
    }